

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttas_spin_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::spin_ttas::basic_mutex<yamc::backoff::exponential<4000U>_>::try_lock
          (basic_mutex<yamc::backoff::exponential<4000U>_> *this)

{
  memory_order mVar1;
  int local_54;
  basic_mutex<yamc::backoff::exponential<4000U>_> *pbStack_50;
  int expected;
  basic_mutex<yamc::backoff::exponential<4000U>_> *this_local;
  int *local_40;
  basic_mutex<yamc::backoff::exponential<4000U>_> *local_38;
  bool local_29;
  
  local_54 = 0;
  local_40 = &local_54;
  this_local._4_4_ = 1;
  this_local._0_4_ = 2;
  pbStack_50 = this;
  local_38 = this;
  mVar1 = std::__cmpexch_failure_order(memory_order_acquire);
  switch(0x1c421b) {
  default:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    break;
  case 2:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    break;
  case 3:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    break;
  case 4:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_29 = local_54 == *(int *)this;
      if (local_29) {
        *(undefined4 *)this = 1;
      }
      UNLOCK();
    }
  }
  return local_29;
}

Assistant:

bool try_lock()
  {
    int expected = 0;
    return state_.compare_exchange_weak(expected, 1, std::memory_order_acquire);
  }